

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_aead_context_t *
ptls_aead_new_direct(ptls_aead_algorithm_t *aead,int is_enc,void *key,void *iv)

{
  int iVar1;
  ptls_aead_context_t *__dest;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  ptls_aead_context_t *ctx;
  long local_70 [8];
  ptls_aead_context_t *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  long local_10;
  ptls_aead_context_t *local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  __dest = (ptls_aead_context_t *)malloc(*(size_t *)(in_RDI + 0x40));
  if (__dest == (ptls_aead_context_t *)0x0) {
    local_8 = (ptls_aead_context_t *)0x0;
  }
  else {
    local_30 = __dest;
    memset(local_70,0,0x40);
    local_70[0] = local_10;
    memcpy(__dest,local_70,0x40);
    iVar1 = (**(code **)(local_10 + 0x48))(local_30,local_14,local_20,local_28);
    if (iVar1 == 0) {
      local_8 = local_30;
    }
    else {
      free(local_30);
      local_8 = (ptls_aead_context_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

ptls_aead_context_t *ptls_aead_new_direct(ptls_aead_algorithm_t *aead, int is_enc, const void *key, const void *iv)
{
    ptls_aead_context_t *ctx;

    if ((ctx = (ptls_aead_context_t *)malloc(aead->context_size)) == NULL)
        return NULL;

    *ctx = (ptls_aead_context_t){aead};

    if (aead->setup_crypto(ctx, is_enc, key, iv) != 0) {
        free(ctx);
        return NULL;
    }

    return ctx;
}